

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O2

BoolExprType eval_bool_expr(BoolExpr *be)

{
  BoolExpr *pBVar1;
  BoolExprType BVar2;
  BoolExprType BVar3;
  BoolExprStruct **ppBVar4;
  
  BVar3 = be->type;
  switch(be->type) {
  case E_FALSE:
  case E_TRUE:
    break;
  default:
    BVar3 = E_UNKNOWN;
    break;
  case E_AND:
    BVar3 = E_TRUE;
    ppBVar4 = &be->subexpr;
    while (pBVar1 = *ppBVar4, pBVar1 != (BoolExpr *)0x0) {
      BVar2 = eval_bool_expr(pBVar1);
      if (BVar2 == E_UNKNOWN) {
        BVar3 = E_UNKNOWN;
      }
      else if (BVar2 == E_FALSE) {
        return E_FALSE;
      }
      ppBVar4 = &pBVar1->next;
    }
    break;
  case E_OR:
    BVar3 = E_FALSE;
    ppBVar4 = &be->subexpr;
    while (pBVar1 = *ppBVar4, pBVar1 != (BoolExpr *)0x0) {
      BVar2 = eval_bool_expr(pBVar1);
      if (BVar2 == E_UNKNOWN) {
        BVar3 = E_UNKNOWN;
      }
      else if (BVar2 == E_TRUE) {
        return E_TRUE;
      }
      ppBVar4 = &pBVar1->next;
    }
    break;
  case E_NOT:
    BVar2 = eval_bool_expr(be->subexpr);
    BVar3 = E_FALSE;
    if (BVar2 != E_TRUE) {
      BVar3 = E_UNKNOWN - (BVar2 == E_FALSE);
    }
  }
  return BVar3;
}

Assistant:

BoolExprType
eval_bool_expr (const BoolExpr *be)
{
  BoolExprType deflt;

  switch (be->type) {
  case E_TRUE:  return E_TRUE;
  case E_FALSE: return E_FALSE;
  case E_NOT:
    switch (eval_bool_expr (be->subexpr)) {
    case E_TRUE:  return E_FALSE;
    case E_FALSE: return E_TRUE;
    default:      return E_UNKNOWN;
    }
  case E_AND:
    deflt = E_TRUE;
    for (be=be->subexpr; be != NULL; be=be->next)
      switch (eval_bool_expr (be)) {
      case E_FALSE:   return E_FALSE;
      case E_UNKNOWN: deflt = E_UNKNOWN; break;   /* Could still be E_FALSE */
      default: break;
      }
    return deflt;
  case E_OR:
    deflt = E_FALSE;
    for (be=be->subexpr; be != NULL; be=be->next)
      switch (eval_bool_expr (be)) {
      case E_TRUE:    return E_TRUE;
      case E_UNKNOWN: deflt = E_UNKNOWN; break;   /* Could still be E_TRUE */
      default: break;
      }
    return deflt;
  default: return E_UNKNOWN;
  }
}